

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_strchr_internal.c
# Opt level: O0

char * host_strchr_internal(char *s,char *set,_Bool first)

{
  char *pcVar1;
  char *local_30;
  char *ret;
  int brackets;
  _Bool first_local;
  char *set_local;
  char *s_local;
  
  ret._0_4_ = 0;
  local_30 = (char *)0x0;
  set_local = s;
  do {
    if (*set_local == '\0') {
      return local_30;
    }
    if (*set_local == '[') {
      ret._0_4_ = (int)ret + 1;
    }
    else if ((*set_local == ']') && (0 < (int)ret)) {
      ret._0_4_ = (int)ret + -1;
    }
    else if ((((int)ret == 0) || (*set_local != ':')) &&
            ((pcVar1 = strchr(set,(int)*set_local), pcVar1 != (char *)0x0 &&
             (local_30 = set_local, first)))) {
      return set_local;
    }
    set_local = set_local + 1;
  } while( true );
}

Assistant:

const char *host_strchr_internal(const char *s, const char *set, bool first)
{
    int brackets = 0;
    const char *ret = NULL;

    while (1) {
        if (!*s)
            return ret;

        if (*s == '[')
            brackets++;
        else if (*s == ']' && brackets > 0)
            brackets--;
        else if (brackets && *s == ':')
            /* never match */ ;
        else if (strchr(set, *s)) {
            ret = s;
            if (first)
                return ret;
        }

        s++;
    }
}